

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O3

float Gia_ObjPropagateRequired(Gia_Man_t *p,int iObj,int fUseSorting)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  void *pvVar5;
  float *pfVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  float fVar13;
  int pPinPerm [32];
  float pPinDelays [32];
  int local_128 [32];
  float local_a8 [34];
  
  if (-1 < iObj) {
    uVar12 = p->vMapping->nSize;
    if (iObj < (int)uVar12) {
      piVar4 = p->vMapping->pArray;
      uVar8 = piVar4[(uint)iObj];
      uVar9 = (ulong)uVar8;
      if (uVar9 == 0) {
        __assert_fail("Gia_ObjIsLut(p, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSpeedup.c"
                      ,0xb1,"float Gia_ObjPropagateRequired(Gia_Man_t *, int, int)");
      }
      pvVar5 = p->pLutLib;
      if (pvVar5 == (void *)0x0) {
        uVar11 = iObj * 3 + 1;
        iVar2 = p->vTiming->nSize;
        if ((int)uVar11 < iVar2) {
          if (((int)uVar8 < 0) || (uVar12 <= uVar8)) goto LAB_00721729;
          pfVar6 = p->vTiming->pArray;
          fVar13 = pfVar6[uVar11] + -1.0;
          uVar12 = piVar4[uVar9];
          if ((int)uVar12 < 1) {
            return fVar13;
          }
          uVar10 = 0;
          while ((-1 < piVar4[uVar9 + uVar10 + 1] &&
                 (uVar8 = piVar4[uVar9 + uVar10 + 1] * 3 + 1, (int)uVar8 < iVar2))) {
            if (fVar13 < pfVar6[uVar8]) {
              pfVar6[uVar8] = fVar13;
            }
            uVar10 = uVar10 + 1;
            if (uVar12 == uVar10) {
              return fVar13;
            }
          }
        }
        goto LAB_0072170a;
      }
      if (*(int *)((long)pvVar5 + 0xc) == 0) {
        if (uVar8 < uVar12 && -1 < (int)uVar8) {
          uVar12 = iObj * 3 + 1;
          iVar2 = p->vTiming->nSize;
          if ((int)uVar12 < iVar2) {
            iVar3 = piVar4[uVar9];
            pfVar6 = p->vTiming->pArray;
            fVar13 = pfVar6[uVar12] - *(float *)((long)pvVar5 + (long)iVar3 * 0x84 + 0x94);
            if (iVar3 < 1) {
              return fVar13;
            }
            lVar7 = 0;
            while ((-1 < piVar4[uVar9 + lVar7 + 1] &&
                   (uVar12 = piVar4[uVar9 + lVar7 + 1] * 3 + 1, (int)uVar12 < iVar2))) {
              if (fVar13 < pfVar6[uVar12]) {
                pfVar6[uVar12] = fVar13;
              }
              lVar7 = lVar7 + 1;
              if (iVar3 == lVar7) {
                return fVar13;
              }
            }
          }
          goto LAB_0072170a;
        }
      }
      else if (uVar8 < uVar12 && -1 < (int)uVar8) {
        uVar12 = piVar4[uVar9];
        lVar7 = (long)(int)uVar12 * 0x84 + 0x94;
        if (fUseSorting == 0) {
          if ((int)uVar12 < 1) {
            return 0.0;
          }
          uVar8 = iObj * 3 + 1;
          iVar2 = p->vTiming->nSize;
          if ((int)uVar8 < iVar2) {
            pfVar6 = p->vTiming->pArray;
            uVar10 = 0;
            while ((-1 < piVar4[uVar9 + uVar10 + 1] &&
                   (uVar11 = piVar4[uVar9 + uVar10 + 1] * 3 + 1, (int)uVar11 < iVar2))) {
              fVar13 = pfVar6[uVar8] - *(float *)((long)pvVar5 + uVar10 * 4 + lVar7);
              if (fVar13 < pfVar6[uVar11]) {
                pfVar6[uVar11] = fVar13;
              }
              uVar10 = uVar10 + 1;
              if (uVar12 == uVar10) {
                return fVar13;
              }
            }
          }
LAB_0072170a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecFlt.h"
                        ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
        }
        Gia_LutDelayTraceSortPins(p,iObj,local_128,local_a8);
        uVar12 = p->vMapping->nSize;
        if (iObj < (int)uVar12) {
          piVar4 = p->vMapping->pArray;
          uVar8 = piVar4[(uint)iObj];
          if ((-1 < (long)(int)uVar8) && (uVar8 < uVar12)) {
            puVar1 = (uint *)(piVar4 + (int)uVar8);
            uVar12 = *puVar1;
            if ((int)uVar12 < 1) {
              return 0.0;
            }
            uVar8 = iObj * 3 + 1;
            iVar2 = p->vTiming->nSize;
            if ((int)uVar8 < iVar2) {
              pfVar6 = p->vTiming->pArray;
              uVar9 = 0;
              while ((uVar11 = puVar1[(long)local_128[uVar9] + 1], -1 < (int)uVar11 &&
                     (uVar11 = uVar11 * 3 + 1, (int)uVar11 < iVar2))) {
                fVar13 = pfVar6[uVar8] - *(float *)((long)pvVar5 + uVar9 * 4 + lVar7);
                if (fVar13 < pfVar6[uVar11]) {
                  pfVar6[uVar11] = fVar13;
                }
                uVar9 = uVar9 + 1;
                if (uVar12 == uVar9) {
                  return fVar13;
                }
              }
            }
            goto LAB_0072170a;
          }
        }
      }
    }
  }
LAB_00721729:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

float Gia_ObjPropagateRequired( Gia_Man_t * p, int iObj, int fUseSorting )
{
    If_LibLut_t * pLutLib = (If_LibLut_t *)p->pLutLib;
    int k, iFanin, pPinPerm[32];
    float pPinDelays[32];
    float tRequired = 0.0; // Suppress "might be used uninitialized"
    float * pDelays;
    assert( Gia_ObjIsLut(p, iObj) );
    if ( pLutLib == NULL )
    {
        tRequired = Gia_ObjTimeRequired( p, iObj) - (float)1.0;
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            if ( Gia_ObjTimeRequired(p, iFanin) > tRequired )
                Gia_ObjSetTimeRequired( p, iFanin, tRequired );
    }
    else if ( !pLutLib->fVarPinDelays )
    {
        pDelays = pLutLib->pLutDelays[Gia_ObjLutSize(p, iObj)];
        tRequired = Gia_ObjTimeRequired(p, iObj) - pDelays[0];
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            if ( Gia_ObjTimeRequired(p, iFanin) > tRequired )
                Gia_ObjSetTimeRequired( p, iFanin, tRequired );
    }
    else 
    {
        pDelays = pLutLib->pLutDelays[Gia_ObjLutSize(p, iObj)];
        if ( fUseSorting )
        {
            Gia_LutDelayTraceSortPins( p, iObj, pPinPerm, pPinDelays );
            Gia_LutForEachFanin( p, iObj, iFanin, k )
            {
                tRequired = Gia_ObjTimeRequired( p, iObj) - pDelays[k];
                if ( Gia_ObjTimeRequired( p, Gia_ObjLutFanin(p, iObj,pPinPerm[k])) > tRequired )
                    Gia_ObjSetTimeRequired( p,  Gia_ObjLutFanin(p, iObj,pPinPerm[k]), tRequired );
            }
        }
        else
        {
            Gia_LutForEachFanin( p, iObj, iFanin, k )
            {
                tRequired = Gia_ObjTimeRequired(p, iObj) - pDelays[k];
                if ( Gia_ObjTimeRequired(p, iFanin) > tRequired )
                    Gia_ObjSetTimeRequired( p,  iFanin, tRequired );
            }
        }
    }
    return tRequired;
}